

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src)

{
  pointer *pppTVar1;
  cmTargetInternals *pcVar2;
  iterator __position;
  auto_ptr<cmCompiledGeneratorExpression> aVar3;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  _Var4;
  size_type sVar5;
  cmSourceFile *pcVar6;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  cmSourceFileLocation sfl;
  auto_ptr<cmCompiledGeneratorExpression> local_c0;
  cmGeneratorExpression local_b8;
  undefined1 local_b0 [16];
  cmListFileBacktrace local_a0;
  cmSourceFileLocation local_70;
  
  cmSourceFileLocation::cmSourceFileLocation(&local_70,this->Makefile,src);
  pcVar2 = (this->Internal).Pointer;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry**,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    ((pcVar2->SourceEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pcVar2->SourceEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  pcVar2 = (this->Internal).Pointer;
  if (_Var4._M_current ==
      (pcVar2->SourceEntries).
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&(pcVar2->SourceFilesMap)._M_t);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace((cmListFileBacktrace *)(local_b0 + 0x10),this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_b0,(cmListFileBacktrace *)(local_b0 + 0x10));
    cmGeneratorExpression::Parse(&local_b8,(string *)local_b0);
    local_c0.x_ = (cmCompiledGeneratorExpression *)local_b8.Backtrace;
    local_b8.Backtrace = (cmListFileBacktrace *)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b8);
    aVar3.x_ = local_c0.x_;
    (local_c0.x_)->EvaluateForBuildsystem = true;
    pcVar2 = (this->Internal).Pointer;
    local_b8.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    local_c0.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_b0._8_8_ = 0;
    (((cmCompiledGeneratorExpression *)local_b8.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)aVar3.x_;
    (((cmCompiledGeneratorExpression *)local_b8.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    __position._M_current =
         (pcVar2->SourceEntries).
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pcVar2->SourceEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->SourceEntries,__position,(TargetPropertyEntry **)&local_b8);
    }
    else {
      *__position._M_current = (TargetPropertyEntry *)local_b8.Backtrace;
      pppTVar1 = &(pcVar2->SourceEntries).
                  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_b0 + 8));
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_c0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b0);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)(local_b0 + 0x10));
  }
  sVar5 = cmGeneratorExpression::Find(src);
  if (sVar5 == 0xffffffffffffffff) {
    pcVar6 = cmMakefile::GetOrCreateSource(this->Makefile,src,false);
  }
  else {
    pcVar6 = (cmSourceFile *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Name._M_dataplus._M_p != &local_70.Name.field_2) {
    operator_delete(local_70.Name._M_dataplus._M_p,local_70.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Directory._M_dataplus._M_p != &local_70.Directory.field_2) {
    operator_delete(local_70.Directory._M_dataplus._M_p,
                    local_70.Directory.field_2._M_allocated_capacity + 1);
  }
  return pcVar6;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src)
{
  cmSourceFileLocation sfl(this->Makefile, src);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl))
                                      == this->Internal->SourceEntries.end())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  if (cmGeneratorExpression::Find(src) != std::string::npos)
    {
    return 0;
    }
  return this->Makefile->GetOrCreateSource(src);
}